

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScenarioCollection.h
# Opt level: O0

void __thiscall
gurkenlaeufer::ScenarioCollection::appendScenario(ScenarioCollection *this,Scenario *scenario)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  ostream *poVar4;
  _Self local_28;
  _Self local_20;
  Scenario *local_18;
  Scenario *scenario_local;
  ScenarioCollection *this_local;
  
  local_18 = scenario;
  scenario_local = (Scenario *)this;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>::end
                 (&scenario->tags);
  iVar2 = std::__cxx11::list<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>::begin
                    (&scenario->tags);
  iVar3 = std::__cxx11::list<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>::end
                    (&scenario->tags);
  local_28._M_node =
       (_List_node_base *)
       std::
       find_if<std::_List_iterator<gurkenlaeufer::Step>,gurkenlaeufer::ScenarioCollection::appendScenario(gurkenlaeufer::Scenario)::_lambda(gurkenlaeufer::Step_const&)_1_>
                 (iVar2._M_node,iVar3._M_node);
  bVar1 = std::operator!=(&local_20,&local_28);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Ignore scenario ");
    std::operator<<(poVar4,(string *)scenario);
  }
  else {
    std::__cxx11::list<gurkenlaeufer::Scenario,_std::allocator<gurkenlaeufer::Scenario>_>::
    emplace_back<gurkenlaeufer::Scenario>(&this->_scenarios,scenario);
  }
  return;
}

Assistant:

void appendScenario(Scenario scenario)
    {
        if (scenario.tags.end() != std::find_if(scenario.tags.begin(), scenario.tags.end(), [](const Step& step) {
            if (detail::toLower(step.step) == "@ignore") {
                return true;
            }
            return false; })) {
            std::cout << "Ignore scenario " << scenario.description;
            return;
        }
        _scenarios.emplace_back(std::move(scenario));
    }